

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

int __thiscall asmjit::CodeHolder::init(CodeHolder *this,EVP_PKEY_CTX *ctx)

{
  size_t *psVar1;
  ulong uVar2;
  Error EVar3;
  void *pvVar4;
  EVP_PKEY_CTX *this_00;
  
  if ((this->_codeInfo)._archInfo.field_0.field_0._type != '\0') {
    return 7;
  }
  if (this->_emitters == (CodeEmitter *)0x0) {
    if (((this->_sections).super_ZoneVectorBase._capacity ==
         (this->_sections).super_ZoneVectorBase._length) &&
       (EVar3 = ZoneVectorBase::_grow(&(this->_sections).super_ZoneVectorBase,&this->_baseHeap,8,1),
       EVar3 != 0)) goto LAB_001708aa;
    this_00 = (EVP_PKEY_CTX *)&this->_baseZone;
    pvVar4 = Zone::allocZeroed((Zone *)this_00,0x58);
    if (pvVar4 != (void *)0x0) {
      *(undefined4 *)((long)pvVar4 + 4) = 3;
      *(undefined8 *)((long)pvVar4 + 0x10) = 0x747865742e;
      uVar2 = (this->_sections).super_ZoneVectorBase._length;
      if (uVar2 < (this->_sections).super_ZoneVectorBase._capacity) {
        *(void **)((long)(this->_sections).super_ZoneVectorBase._data + uVar2 * 8) = pvVar4;
        psVar1 = &(this->_sections).super_ZoneVectorBase._length;
        *psVar1 = *psVar1 + 1;
        (this->_codeInfo)._archInfo.field_0.field_0 =
             *(anon_struct_4_4_3fa876f7_for_anon_union_4_2_424c626f_for_ArchInfo_0_0 *)ctx;
        (this->_codeInfo).field_1 = *(anon_union_4_2_314a35c9_for_CodeInfo_1 *)(ctx + 4);
        (this->_codeInfo)._baseAddress = *(uint64_t *)(ctx + 8);
        return 0;
      }
      init(this_00);
    }
  }
  else {
    init((EVP_PKEY_CTX *)this);
  }
  EVar3 = 1;
LAB_001708aa:
  Zone::reset(&this->_baseZone,false);
  return EVar3;
}

Assistant:

Error CodeHolder::init(const CodeInfo& info) noexcept {
  // Cannot reinitialize if it's locked or there is one or more CodeEmitter
  // attached.
  if (isInitialized())
    return DebugUtils::errored(kErrorAlreadyInitialized);

  // If we are just initializing there should be no emitters attached).
  ASMJIT_ASSERT(_emitters == nullptr);

  // Create the default section and insert it to the `_sections` array.
  Error err = _sections.willGrow(&_baseHeap);
  if (err == kErrorOk) {
    SectionEntry* se = _baseZone.allocZeroedT<SectionEntry>();
    if (ASMJIT_LIKELY(se)) {
      se->_flags = SectionEntry::kFlagExec | SectionEntry::kFlagConst;
      se->_setDefaultName('.', 't', 'e', 'x', 't');
      _sections.appendUnsafe(se);
    }
    else {
      err = DebugUtils::errored(kErrorNoHeapMemory);
    }
  }

  if (ASMJIT_UNLIKELY(err)) {
    _baseZone.reset(false);
    return err;
  }
  else {
    _codeInfo = info;
    return kErrorOk;
  }
}